

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O0

void curious_call_callbacks(curious_callback_type_t type,void *io_args)

{
  undefined8 *puVar1;
  curious_callback_data_t *data;
  undefined1 auStack_30 [4];
  int i;
  curious_dynamic_array_t callbacks;
  void *io_args_local;
  curious_callback_type_t type_local;
  
  auStack_30 = (undefined1  [4])callback_registry[type].last_el;
  unique0x00012004 = callback_registry[type].len;
  callbacks._0_8_ = callback_registry[type].el_size;
  callbacks.el_size = (size_t)callback_registry[type].array;
  callbacks.array = io_args;
  for (data._4_4_ = 0; data._4_4_ <= (int)auStack_30; data._4_4_ = data._4_4_ + 1) {
    puVar1 = (undefined8 *)
             get_from_curious_dynamic_array((curious_dynamic_array_t *)auStack_30,data._4_4_);
    (*(code *)*puVar1)(type,puVar1[1],callbacks.array);
  }
  return;
}

Assistant:

void curious_call_callbacks(curious_callback_type_t type, void* io_args)
{
    //lookup the list of registred functions of the specified type...
    curious_dynamic_array_t callbacks = callback_registry[type];

    //...and run every one
    for (int i = 0; i <= callbacks.last_el; ++i) {
        curious_callback_data_t* data = (curious_callback_data_t*) (get_from_curious_dynamic_array(&callbacks, i));

        //usr_data was registered with the function earlier,
        //io_args was just passed to the IO function in the main code
        data->callback(type, data->usr_args, io_args);
    }
}